

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          string *linkLibs,string *flags,string *linkFlags,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *target)

{
  cmMakefile *pcVar1;
  cmSourceFile *this_00;
  size_type sVar2;
  bool bVar3;
  TargetType TVar4;
  string *psVar5;
  _Alloc_hider _Var6;
  char *pcVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  string linkLanguage;
  string buildType;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string local_138;
  allocator<char> local_10a;
  allocator<char> local_109;
  string local_108;
  cmComputeLinkInformation *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  cmLinkLineComputer *local_78;
  string *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string *local_40;
  cmOutputConverter *local_38;
  
  local_70 = linkLibs;
  cmsys::SystemTools::UpperCase(&local_b8,config);
  local_e0 = cmGeneratorTarget::GetLinkInformation(target,config);
  local_78 = linkLineComputer;
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(&local_d8,linkLineComputer,target,&local_b8);
  TVar4 = cmGeneratorTarget::GetType(target);
  switch(TVar4) {
  case EXECUTABLE:
    bVar3 = std::operator!=(&local_d8,"Swift");
    if (bVar3) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"CMAKE_EXE_LINKER_FLAGS",(allocator<char> *)&local_108);
      cmMakefile::GetSafeDefinition(pcVar1,&local_138);
      std::__cxx11::string::append((string *)linkFlags);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::append((char *)linkFlags);
      if (local_b8._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"CMAKE_EXE_LINKER_FLAGS_",(allocator<char> *)&local_108);
        std::__cxx11::string::append((string *)&local_138);
        cmMakefile::GetSafeDefinition(this->Makefile,&local_138);
        std::__cxx11::string::append((string *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::~string((string *)&local_138);
      }
      if (local_d8._M_string_length == 0) {
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        std::operator+(&local_138,"CMake can not determine linker language for target: ",psVar5);
        cmSystemTools::Error(&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        goto LAB_001d9c60;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"WIN32_EXECUTABLE",(allocator<char> *)&local_108);
      bVar3 = cmGeneratorTarget::GetPropertyAsBool(target,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      pcVar1 = this->Makefile;
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"CMAKE_CREATE_WIN32_EXE",(allocator<char> *)&local_108);
        cmMakefile::GetSafeDefinition(pcVar1,&local_138);
        std::__cxx11::string::append((string *)linkFlags);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"CMAKE_CREATE_CONSOLE_EXE",(allocator<char> *)&local_108);
        cmMakefile::GetSafeDefinition(pcVar1,&local_138);
        std::__cxx11::string::append((string *)linkFlags);
      }
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::append((char *)linkFlags);
      bVar3 = cmGeneratorTarget::IsExecutableWithExports(target);
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"CMAKE_EXE_EXPORTS_",(allocator<char> *)&local_108);
        std::__cxx11::string::append((string *)&local_138);
        std::__cxx11::string::append((char *)&local_138);
        cmMakefile::GetSafeDefinition(this->Makefile,&local_138);
        std::__cxx11::string::append((string *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::~string((string *)&local_138);
      }
    }
    AddLanguageFlagsForLinking(this,flags,target,&local_d8,&local_b8);
    if (local_e0 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,local_e0,local_78,local_70,frameworkPath,linkPath);
    }
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"BUILD_SHARED_LIBS",(allocator<char> *)&local_108);
    pcVar7 = cmMakefile::GetDefinition(pcVar1,&local_138);
    bVar3 = cmSystemTools::IsOn(pcVar7);
    std::__cxx11::string::~string((string *)&local_138);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"CMAKE_SHARED_BUILD_",&local_109);
      std::operator+(&local_108,&local_98,&local_d8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"_FLAGS",&local_10a);
      std::operator+(&local_138,&local_108,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_98);
      cmMakefile::GetSafeDefinition(this->Makefile,&local_138);
      std::__cxx11::string::append((string *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::~string((string *)&local_138);
    }
    GetLinkLibsCMP0065(&local_138,this,&local_d8,target);
    if (local_138._M_string_length != 0) {
      std::__cxx11::string::append((string *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"LINK_FLAGS",(allocator<char> *)&local_98);
    pcVar7 = cmGeneratorTarget::GetProperty(target,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    if (pcVar7 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (local_b8._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"LINK_FLAGS_",(allocator<char> *)&local_98);
      std::__cxx11::string::append((string *)&local_108);
      pcVar7 = cmGeneratorTarget::GetProperty(target,&local_108);
      if (pcVar7 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      std::__cxx11::string::~string((string *)&local_108);
    }
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    cmGeneratorTarget::GetLinkOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_108,config,&local_d8);
    AppendCompileOptions
              (this,linkFlags,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_108,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_108);
    std::__cxx11::string::~string((string *)&local_138);
    break;
  case STATIC_LIBRARY:
    GetStaticLibraryFlags(this,linkFlags,&local_b8,&local_d8,target);
    break;
  case SHARED_LIBRARY:
    pcVar7 = "CMAKE_SHARED_LINKER_FLAGS";
    goto LAB_001d946b;
  case MODULE_LIBRARY:
    pcVar7 = "CMAKE_MODULE_LINKER_FLAGS";
LAB_001d946b:
    bVar3 = std::operator!=(&local_d8,"Swift");
    if (bVar3) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pcVar7,(allocator<char> *)&local_108);
      cmMakefile::GetSafeDefinition(pcVar1,&local_138);
      std::__cxx11::string::_M_assign((string *)linkFlags);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::append((char *)linkFlags);
      if (local_b8._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,pcVar7,(allocator<char> *)&local_108);
        std::__cxx11::string::append((char *)&local_138);
        std::__cxx11::string::append((string *)&local_138);
        cmMakefile::GetSafeDefinition(this->Makefile,&local_138);
        std::__cxx11::string::append((string *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::~string((string *)&local_138);
      }
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"WIN32",(allocator<char> *)&local_68);
      bVar3 = cmMakefile::IsOn(pcVar1,&local_138);
      if (bVar3) {
        pcVar1 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"CYGWIN",&local_109)
        ;
        bVar3 = cmMakefile::IsOn(pcVar1,&local_108);
        if (!bVar3) {
          pcVar1 = this->Makefile;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"MINGW",&local_10a)
          ;
          bVar3 = cmMakefile::IsOn(pcVar1,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_138);
          if (!bVar3) {
            local_68._M_dataplus._M_p = (pointer)0x0;
            local_68._M_string_length = 0;
            local_68.field_2._M_allocated_capacity = 0;
            cmGeneratorTarget::GetSourceFiles
                      (target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_68,
                       &local_b8);
            pcVar1 = this->Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_108,"CMAKE_LINK_DEF_FILE_FLAG",(allocator<char> *)&local_98)
            ;
            local_40 = config;
            psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_108);
            std::__cxx11::string::string((string *)&local_138,(string *)psVar5);
            std::__cxx11::string::~string((string *)&local_108);
            sVar2 = local_68._M_string_length;
            local_38 = &this->super_cmOutputConverter;
            for (_Var6._M_p = local_68._M_dataplus._M_p; _Var6._M_p != (pointer)sVar2;
                _Var6._M_p = _Var6._M_p + 8) {
              this_00 = *(cmSourceFile **)_Var6._M_p;
              psVar5 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
              bVar3 = std::operator==(psVar5,"def");
              if (bVar3) {
                std::__cxx11::string::append((string *)linkFlags);
                psVar5 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
                cmsys::SystemTools::CollapseFullPath(&local_98,psVar5);
                cmOutputConverter::ConvertToOutputFormat(&local_108,local_38,&local_98,SHELL);
                std::__cxx11::string::append((string *)linkFlags);
                std::__cxx11::string::~string((string *)&local_108);
                std::__cxx11::string::~string((string *)&local_98);
                std::__cxx11::string::append((char *)linkFlags);
              }
            }
            std::__cxx11::string::~string((string *)&local_138);
            std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                      ((_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_68);
            config = local_40;
          }
          goto LAB_001d95c2;
        }
        std::__cxx11::string::~string((string *)&local_108);
      }
      std::__cxx11::string::~string((string *)&local_138);
    }
LAB_001d95c2:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"LINK_FLAGS",(allocator<char> *)&local_108);
    pcVar7 = cmGeneratorTarget::GetProperty(target,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    if (pcVar7 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (local_b8._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"LINK_FLAGS_",(allocator<char> *)&local_108);
      std::__cxx11::string::append((string *)&local_138);
      pcVar7 = cmGeneratorTarget::GetProperty(target,&local_138);
      if (pcVar7 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      std::__cxx11::string::~string((string *)&local_138);
    }
    local_138._M_dataplus._M_p = (pointer)0x0;
    local_138._M_string_length = 0;
    local_138.field_2._M_allocated_capacity = 0;
    cmGeneratorTarget::GetLinkOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_138,config,&local_d8);
    AppendCompileOptions
              (this,linkFlags,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_138,(char *)0x0);
    if (local_e0 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,local_e0,local_78,local_70,frameworkPath,linkPath);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_138);
  }
  AppendPositionIndependentLinkerFlags(this,linkFlags,target,config,&local_d8);
  AppendIPOLinkerFlags(this,linkFlags,target,config,&local_d8);
LAB_001d9c60:
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::string& linkLibs, std::string& flags, std::string& linkFlags,
  std::string& frameworkPath, std::string& linkPath, cmGeneratorTarget* target)
{
  const std::string buildType = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, buildType);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      this->GetStaticLibraryFlags(linkFlags, buildType, linkLanguage, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      if (linkLanguage != "Swift") {
        linkFlags = this->Makefile->GetSafeDefinition(libraryLinkVariable);
        linkFlags += " ";
        if (!buildType.empty()) {
          std::string build = libraryLinkVariable;
          build += "_";
          build += buildType;
          linkFlags += this->Makefile->GetSafeDefinition(build);
          linkFlags += " ";
        }
        if (this->Makefile->IsOn("WIN32") &&
            !(this->Makefile->IsOn("CYGWIN") ||
              this->Makefile->IsOn("MINGW"))) {
          std::vector<cmSourceFile*> sources;
          target->GetSourceFiles(sources, buildType);
          std::string defFlag =
            this->Makefile->GetSafeDefinition("CMAKE_LINK_DEF_FILE_FLAG");
          for (cmSourceFile* sf : sources) {
            if (sf->GetExtension() == "def") {
              linkFlags += defFlag;
              linkFlags += this->ConvertToOutputFormat(
                cmSystemTools::CollapseFullPath(sf->GetFullPath()), SHELL);
              linkFlags += " ";
            }
          }
        }
      }

      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }

      std::vector<std::string> opts;
      target->GetLinkOptions(opts, config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, opts);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      if (linkLanguage != "Swift") {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
        linkFlags += " ";
        if (!buildType.empty()) {
          std::string build = "CMAKE_EXE_LINKER_FLAGS_";
          build += buildType;
          linkFlags += this->Makefile->GetSafeDefinition(build);
          linkFlags += " ";
        }
        if (linkLanguage.empty()) {
          cmSystemTools::Error(
            "CMake can not determine linker language for target: " +
            target->GetName());
          return;
        }

        if (target->GetPropertyAsBool("WIN32_EXECUTABLE")) {
          linkFlags +=
            this->Makefile->GetSafeDefinition("CMAKE_CREATE_WIN32_EXE");
          linkFlags += " ";
        } else {
          linkFlags +=
            this->Makefile->GetSafeDefinition("CMAKE_CREATE_CONSOLE_EXE");
          linkFlags += " ";
        }

        if (target->IsExecutableWithExports()) {
          std::string exportFlagVar = "CMAKE_EXE_EXPORTS_";
          exportFlagVar += linkLanguage;
          exportFlagVar += "_FLAG";

          linkFlags += this->Makefile->GetSafeDefinition(exportFlagVar);
          linkFlags += " ";
        }
      }

      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, buildType);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }

      if (cmSystemTools::IsOn(
            this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
        std::string sFlagVar = std::string("CMAKE_SHARED_BUILD_") +
          linkLanguage + std::string("_FLAGS");
        linkFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        linkFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        linkFlags += cmp0065Flags;
        linkFlags += " ";
      }

      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }

      std::vector<std::string> opts;
      target->GetLinkOptions(opts, config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, opts);
    } break;
    default:
      break;
  }

  this->AppendPositionIndependentLinkerFlags(linkFlags, target, config,
                                             linkLanguage);
  this->AppendIPOLinkerFlags(linkFlags, target, config, linkLanguage);
}